

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

void MaxDiffsForRow(int width,int stride,uint32_t *argb,uint8_t *max_diffs,int used_subtract_green)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint p1;
  uint p2;
  uint uVar4;
  long lVar5;
  
  if (2 < width) {
    uVar2 = *argb;
    p1 = argb[1];
    if (used_subtract_green != 0) {
      uVar2 = uVar2 & 0xff00ff00 |
              (uVar2 >> 8) * 0x10000 + (uVar2 & 0xff00ff) + (uVar2 >> 8 & 0xff) & 0xff00ff;
      p1 = p1 & 0xff00ff00 | (p1 >> 8) * 0x10000 + (p1 & 0xff00ff) + (p1 >> 8 & 0xff) & 0xff00ff;
    }
    lVar5 = 0;
    do {
      uVar4 = argb[(1 - stride) + (int)lVar5];
      uVar3 = argb[(long)stride + lVar5 + 1];
      p2 = argb[lVar5 + 2];
      if (used_subtract_green != 0) {
        uVar4 = uVar4 & 0xff00ff00 |
                (uVar4 >> 8) * 0x10000 + (uVar4 & 0xff00ff) + (uVar4 >> 8 & 0xff) & 0xff00ff;
        uVar3 = uVar3 & 0xff00ff00 |
                (uVar3 >> 8) * 0x10000 + (uVar3 & 0xff00ff) + (uVar3 >> 8 & 0xff) & 0xff00ff;
        p2 = p2 & 0xff00ff00 | (p2 >> 8) * 0x10000 + (p2 & 0xff00ff) + (p2 >> 8 & 0xff) & 0xff00ff;
      }
      uVar1 = MaxDiffBetweenPixels(p1,uVar4);
      uVar4 = MaxDiffBetweenPixels(p1,uVar3);
      uVar3 = MaxDiffBetweenPixels(p1,uVar2);
      uVar2 = MaxDiffBetweenPixels(p1,p2);
      if (uVar4 < uVar1) {
        uVar4 = uVar1;
      }
      if (uVar2 < uVar3) {
        uVar2 = uVar3;
      }
      if (uVar2 < uVar4) {
        uVar2 = uVar4;
      }
      max_diffs[lVar5 + 1] = (uint8_t)uVar2;
      lVar5 = lVar5 + 1;
      uVar2 = p1;
      p1 = p2;
    } while ((ulong)(width - 1) - 1 != lVar5);
  }
  return;
}

Assistant:

static void MaxDiffsForRow(int width, int stride, const uint32_t* const argb,
                           uint8_t* const max_diffs, int used_subtract_green) {
  uint32_t current, up, down, left, right;
  int x;
  if (width <= 2) return;
  current = argb[0];
  right = argb[1];
  if (used_subtract_green) {
    current = AddGreenToBlueAndRed(current);
    right = AddGreenToBlueAndRed(right);
  }
  // max_diffs[0] and max_diffs[width - 1] are never used.
  for (x = 1; x < width - 1; ++x) {
    up = argb[-stride + x];
    down = argb[stride + x];
    left = current;
    current = right;
    right = argb[x + 1];
    if (used_subtract_green) {
      up = AddGreenToBlueAndRed(up);
      down = AddGreenToBlueAndRed(down);
      right = AddGreenToBlueAndRed(right);
    }
    max_diffs[x] = MaxDiffAroundPixel(current, up, down, left, right);
  }
}